

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_aead128a.c
# Opt level: O0

size_t ascon_aead128a_encrypt_update
                 (ascon_aead_ctx_t *ctx,uint8_t *ciphertext,uint8_t *plaintext,size_t plaintext_len)

{
  size_t sVar1;
  ascon_aead_ctx_t *in_RCX;
  undefined8 in_RDX;
  size_t in_RSI;
  absorb_fptr in_RDI;
  uint8_t *unaff_retaddr;
  uint8_t rate;
  
  rate = (uint8_t)((ulong)in_RDX >> 0x38);
  if (in_RDI[0x39] != (_func_void_ascon_sponge_t_ptr_uint8_t_ptr_uint8_t_ptr)0x9) {
    ascon_128a_finalise_assoc_data(in_RCX);
  }
  in_RDI[0x39] = (code)0x9;
  sVar1 = buffered_accumulation
                    ((ascon_bufstate_t *)plaintext,(uint8_t *)plaintext_len,unaff_retaddr,in_RDI,
                     in_RSI,rate);
  return sVar1;
}

Assistant:

ASCON_API size_t
ascon_aead128a_encrypt_update(ascon_aead_ctx_t* const ctx,
                              uint8_t* ciphertext,
                              const uint8_t* plaintext,
                              size_t plaintext_len)
{
    ASCON_ASSERT(ctx != NULL);
    ASCON_ASSERT(plaintext_len == 0 || plaintext != NULL);
    ASCON_ASSERT(plaintext_len == 0 || ciphertext != NULL);
    ASCON_ASSERT(ctx->bufstate.flow_state == ASCON_FLOW_AEAD128a_INITIALISED
                 || ctx->bufstate.flow_state == ASCON_FLOW_AEAD128a_ASSOC_DATA_UPDATED
                 || ctx->bufstate.flow_state == ASCON_FLOW_AEAD128a_ENCRYPT_UPDATED);
    if (ctx->bufstate.flow_state != ASCON_FLOW_AEAD128a_ENCRYPT_UPDATED)
    {
        // Finalise the associated data if not already done sos.
        ascon_128a_finalise_assoc_data(ctx);
    }
    ctx->bufstate.flow_state = ASCON_FLOW_AEAD128a_ENCRYPT_UPDATED;
    // Start absorbing plaintext and simultaneously squeezing out ciphertext
    return buffered_accumulation(&ctx->bufstate, ciphertext, plaintext,
                                 absorb_plaintext, plaintext_len,
                                 ASCON_DOUBLE_RATE);
}